

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IndirectDispatchCase::iterate(IndirectDispatchCase *this)

{
  pointer *ppuVar1;
  RenderContext *pRVar2;
  TestLog *log;
  pointer pDVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  mapped_type *pmVar8;
  ProgramSources *pPVar9;
  MessageBuilder *pMVar10;
  Functions *pFVar11;
  undefined4 extraout_var_01;
  pointer pDVar12;
  ostream *poVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  void *pvVar14;
  undefined8 extraout_RAX;
  TestError *pTVar15;
  uint *puVar16;
  char *description;
  long lVar17;
  pointer puVar18;
  Functions *pFVar19;
  ulong uVar20;
  bool bVar21;
  allocator<char> local_4c9;
  Functions *local_4c8;
  deUintptr *local_4c0;
  Functions *local_4b8;
  undefined1 local_4b0 [40];
  ScopedLogSection section;
  Buffer cmdBuffer;
  Buffer resultBuffer;
  unsigned_long local_428;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ShaderProgram program_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram program;
  undefined4 extraout_var_00;
  
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  section.m_log._0_4_ = (this->m_workGroupSize).m_data[0];
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  de::toString<unsigned_int>((string *)&data,(uint *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4b0,"LOCAL_SIZE_X",(allocator<char> *)&cmdBuffer);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)local_4b0);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&data);
  std::__cxx11::string::~string((string *)local_4b0);
  std::__cxx11::string::~string((string *)&data);
  section.m_log._0_4_ = (this->m_workGroupSize).m_data[1];
  de::toString<unsigned_int>((string *)&data,(uint *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4b0,"LOCAL_SIZE_Y",(allocator<char> *)&cmdBuffer);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)local_4b0);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&data);
  std::__cxx11::string::~string((string *)local_4b0);
  std::__cxx11::string::~string((string *)&data);
  section.m_log._0_4_ = (this->m_workGroupSize).m_data[2];
  de::toString<unsigned_int>((string *)&data,(uint *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4b0,"LOCAL_SIZE_Z",(allocator<char> *)&cmdBuffer);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)local_4b0);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&data);
  std::__cxx11::string::~string((string *)local_4b0);
  std::__cxx11::string::~string((string *)&data);
  memset(&data,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resultBuffer,
             "#version 310 es\nlayout(local_size_x = ${LOCAL_SIZE_X}, local_size_y = ${LOCAL_SIZE_Y}, local_size_z = ${LOCAL_SIZE_Z}) in;\nlayout(binding = 0, std430) buffer Result\n{\n    uvec3           expectedGroupCount;\n    coherent uint   numPassed;\n} result;\nvoid main (void)\n{\n    if (all(equal(result.expectedGroupCount, gl_NumWorkGroups)))\n        atomicAdd(result.numPassed, 1u);\n}\n"
             ,(allocator<char> *)&local_428);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&cmdBuffer,(string *)&resultBuffer);
  tcu::StringTemplate::specialize((string *)&section,(StringTemplate *)&cmdBuffer,&args);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_4b0,(string *)&section);
  pPVar9 = glu::ProgramSources::operator<<((ProgramSources *)&data,(ShaderSource *)local_4b0);
  glu::ProgramSources::ProgramSources((ProgramSources *)&program_1,pPVar9);
  std::__cxx11::string::~string((string *)(local_4b0 + 8));
  std::__cxx11::string::~string((string *)&section);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&cmdBuffer);
  std::__cxx11::string::~string((string *)&resultBuffer);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args._M_t);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)&program_1);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program_1);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&cmdBuffer,pRVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&resultBuffer,pRVar2);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Compile failed","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
               ,0x15e);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
  std::operator<<((ostream *)ppuVar1,"GL_DISPATCH_INDIRECT_BUFFER size = ");
  pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&data,&this->m_bufferSize);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&data,"Commands",&local_4c9);
  local_428 = ((long)(this->m_commands).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_commands).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  de::toString<unsigned_long>((string *)local_4b0,&local_428);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 "Indirect Dispatch Commands (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 " in total)");
  local_4c0 = &this->m_bufferSize;
  local_4b8 = (Functions *)CONCAT44(extraout_var,iVar5);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&data,(string *)&program_1);
  std::__cxx11::string::~string((string *)&program_1);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)local_4b0);
  std::__cxx11::string::~string((string *)&data);
  lVar17 = 8;
  ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (uVar20 = 0;
      uVar20 < (ulong)(((long)(this->m_commands).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_commands).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar20 = uVar20 + 1
      ) {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
    std::operator<<((ostream *)ppuVar1,": ");
    std::operator<<((ostream *)ppuVar1,"offset = ");
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&data,
                         (long *)((long)(((this->m_commands).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->numWorkGroups)
                                        .m_data + lVar17 + -0x10));
    std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", numWorkGroups = ");
    tcu::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    (Vector<unsigned_int,_3> *)
                    ((long)(((this->m_commands).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                             ._M_impl.super__Vector_impl_data._M_start)->numWorkGroups).m_data +
                    lVar17 + -8));
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
    lVar17 = lVar17 + 0x18;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  dVar6 = resultBuffer.super_ObjectWrapper.m_object;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar19 = local_4b8;
  pFVar11 = (Functions *)CONCAT44(extraout_var_00,iVar5);
  iVar5 = getResultBlockAlignedSize(pFVar11);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(long)((int)(((long)(this->m_commands).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_commands).
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) * iVar5),
             (allocator_type *)&program_1);
  pDVar12 = (this->m_commands).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = ((long)(this->m_commands).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) / 0x18;
  puVar16 = (pDVar12->numWorkGroups).m_data + 2;
  puVar18 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0xc;
  while (bVar21 = lVar17 != 0, lVar17 = lVar17 + -1, bVar21) {
    *(uint *)(puVar18 + -0xc) = ((UVec3 *)(puVar16 + -2))->m_data[0];
    *(uint *)(puVar18 + -8) = puVar16[-1];
    *(uint *)(puVar18 + -4) = *puVar16;
    puVar18[0] = '\0';
    puVar18[1] = '\0';
    puVar18[2] = '\0';
    puVar18[3] = '\0';
    puVar16 = puVar16 + 6;
    puVar18 = puVar18 + iVar5;
  }
  (*pFVar11->bindBuffer)(0x90d2,dVar6);
  (*pFVar11->bufferData)
            (0x90d2,(long)((int)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (int)data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  dVar6 = cmdBuffer.super_ObjectWrapper.m_object;
  if (this->m_genBuffer == GEN_BUFFER_COMPUTE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&data);
    local_4c8 = (Functions *)CONCAT44(local_4c8._4_4_,dVar6);
    std::operator<<((ostream *)&data,
                    "#version 310 es\nlayout(local_size_x = 1) in;\nlayout(std430, binding = 1) buffer Out\n{\n\thighp uint data[];\n};\nvoid writeCmd (uint offset, uvec3 numWorkGroups)\n{\n\tdata[offset+0u] = numWorkGroups.x;\n\tdata[offset+1u] = numWorkGroups.y;\n\tdata[offset+2u] = numWorkGroups.z;\n}\nvoid main (void)\n{\n"
                   );
    for (pDVar12 = (this->m_commands).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pDVar12 !=
        (this->m_commands).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish; pDVar12 = pDVar12 + 1) {
      poVar13 = std::operator<<((ostream *)&data,"\twriteCmd(");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13,"u, uvec3(");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13,"u, ");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      poVar13 = std::operator<<(poVar13,"u, ");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::operator<<(poVar13,"u));\n");
    }
    std::operator<<((ostream *)&data,"}\n");
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pFVar19 = local_4b8;
    lVar17 = CONCAT44(extraout_var_02,iVar5);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(&args,0,0xac);
    std::__cxx11::stringbuf::str();
    glu::ComputeSource::ComputeSource((ComputeSource *)local_4b0,(string *)&section);
    pFVar11 = local_4c8;
    pPVar9 = glu::ProgramSources::operator<<((ProgramSources *)&args,(ShaderSource *)local_4b0);
    glu::ShaderProgram::ShaderProgram(&program_1,pRVar2,pPVar9);
    std::__cxx11::string::~string((string *)(local_4b0 + 8));
    std::__cxx11::string::~string((string *)&section);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&args);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    &program_1);
    if (program_1.m_program.m_info.linkOk == false) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar15,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                 ,0xf6);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar17 + 0x1680))(program_1.m_program.m_program);
    (**(code **)(lVar17 + 0x40))(0x90ee,(ulong)pFVar11 & 0xffffffff);
    (**(code **)(lVar17 + 0x150))(0x90ee,*local_4c0,0,0x88e4);
    (**(code **)(lVar17 + 0x48))(0x90d2,1,(ulong)pFVar11 & 0xffffffff);
    dVar6 = (**(code **)(lVar17 + 0x800))();
    glu::checkError(dVar6,"Buffer setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                    ,0xfd);
    (**(code **)(lVar17 + 0x528))(1,1,1);
    dVar6 = (**(code **)(lVar17 + 0x800))();
    glu::checkError(dVar6,"glDispatchCompute() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                    ,0x100);
    (**(code **)(lVar17 + 0xdb8))(0x40);
    dVar6 = (**(code **)(lVar17 + 0x800))();
    glu::checkError(dVar6,"glMemoryBarrier(GL_COMMAND_BARRIER_BIT) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                    ,0x103);
    glu::ShaderProgram::~ShaderProgram(&program_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&data);
  }
  else if (this->m_genBuffer == GEN_BUFFER_UPLOAD) {
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&data,*local_4c0,(allocator_type *)&program_1);
    pDVar3 = (this->m_commands).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar12 = (this->m_commands).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar12 != pDVar3;
        pDVar12 = pDVar12 + 1) {
      lVar17 = pDVar12->offset;
      *(uint *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar17) = (pDVar12->numWorkGroups).m_data[0];
      *(uint *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar17 + 4) = (pDVar12->numWorkGroups).m_data[1];
      *(uint *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar17 + 8) = (pDVar12->numWorkGroups).m_data[2];
    }
    (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x40))(0x90ee,dVar6);
    (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x150))
              (0x90ee,CONCAT44(data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) -
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  (*pFVar19->useProgram)(program.m_program.m_program);
  (*pFVar19->bindBuffer)(0x90ee,cmdBuffer.super_ObjectWrapper.m_object);
  GVar7 = (*pFVar19->getError)();
  glu::checkError(GVar7,"State setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                  ,0x16f);
  iVar5 = getResultBlockAlignedSize(pFVar19);
  lVar17 = 0;
  for (pDVar12 = (this->m_commands).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pDVar12 !=
      (this->m_commands).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pDVar12 = pDVar12 + 1) {
    (*pFVar19->bindBufferRange)
              (0x90d2,0,resultBuffer.super_ObjectWrapper.m_object,lVar17,(long)iVar5);
    (*pFVar19->dispatchComputeIndirect)(pDVar12->offset);
    lVar17 = lVar17 + iVar5;
  }
  GVar7 = (*pFVar19->getError)();
  glu::checkError(GVar7,"glDispatchComputeIndirect() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                  ,0x17e);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar19 = (Functions *)CONCAT44(extraout_var_03,iVar5);
  iVar5 = getResultBlockAlignedSize(pFVar19);
  pDVar12 = (this->m_commands).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->m_commands).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (*pFVar19->bindBuffer)(0x90d2,resultBuffer.super_ObjectWrapper.m_object);
  pvVar14 = (*pFVar19->mapBufferRange)
                      (0x90d2,0,(long)((int)(((long)pDVar3 - (long)pDVar12) / 0x18) * iVar5),1);
  GVar7 = (*pFVar19->getError)();
  glu::checkError(GVar7,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                  ,0x133);
  local_4c8 = pFVar19;
  if (pvVar14 != (void *)0x0) {
    pFVar19 = (Functions *)((long)pvVar14 + 0xc);
    lVar17 = 0x10;
    ppuVar1 = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    uVar20 = 0;
    local_4c0._0_4_ = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    while( true ) {
      uVar4 = (uint)local_4c0;
      pFVar11 = local_4c8;
      pDVar12 = (this->m_commands).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_commands).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::IndirectDispatchCase::DispatchCommand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) / 0x18) <=
          uVar20) break;
      if (*(int *)&pFVar19->activeShaderProgram !=
          (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
          (this->m_workGroupSize).m_data[2] *
          *(int *)((long)(pDVar12->numWorkGroups).m_data + lVar17 + -0x10) *
          *(int *)((long)(&pDVar12->numWorkGroups + -1) + lVar17) *
          *(int *)((long)(pDVar12->numWorkGroups).m_data + lVar17 + -8)) {
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_4b8 = pFVar19;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
        std::operator<<((ostream *)ppuVar1,"ERROR: got invalid result for invocation ");
        std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
        std::operator<<((ostream *)ppuVar1,": got numPassed = ");
        std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
        std::operator<<((ostream *)ppuVar1,", expected ");
        std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
        local_4c0._0_4_ = 0;
        pFVar19 = local_4b8;
      }
      uVar20 = uVar20 + 1;
      lVar17 = lVar17 + 0x18;
      pFVar19 = (Functions *)((long)&pFVar19->activeShaderProgram + (long)iVar5);
    }
    (*local_4c8->unmapBuffer)(0x90d2);
    GVar7 = (*pFVar11->getError)();
    glu::checkError(GVar7,"glUnmapBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
                    ,0x14e);
    description = "Invalid values in result buffer";
    if ((uVar4 & 1) != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~(byte)uVar4 & QP_TEST_RESULT_FAIL,description);
    glu::ObjectWrapper::~ObjectWrapper(&resultBuffer.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&cmdBuffer.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram(&program);
    return STOP;
  }
  pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar15,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndirectComputeDispatchTests.cpp"
             ,0x134);
  __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IndirectDispatchCase::IterateResult IndirectDispatchCase::iterate (void)
{
	const glu::RenderContext&		renderCtx			= m_context.getRenderContext();
	const glw::Functions&			gl					= renderCtx.getFunctions();

	const glu::ShaderProgram		program				(renderCtx, genVerifySources(m_workGroupSize));

	glu::Buffer						cmdBuffer			(renderCtx);
	glu::Buffer						resultBuffer		(renderCtx);

	m_testCtx.getLog() << program;
	TCU_CHECK_MSG(program.isOk(), "Compile failed");

	m_testCtx.getLog() << TestLog::Message << "GL_DISPATCH_INDIRECT_BUFFER size = " << m_bufferSize << TestLog::EndMessage;
	{
		tcu::ScopedLogSection section(m_testCtx.getLog(), "Commands", "Indirect Dispatch Commands (" + de::toString(m_commands.size()) + " in total)");

		for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
			m_testCtx.getLog() << TestLog::Message << cmdNdx << ": " << "offset = " << m_commands[cmdNdx].offset
												   << ", numWorkGroups = " << m_commands[cmdNdx].numWorkGroups
							   << TestLog::EndMessage;
	}

	createResultBuffer(*resultBuffer);
	createCommandBuffer(*cmdBuffer);

	gl.useProgram(program.getProgram());
	gl.bindBuffer(GL_DISPATCH_INDIRECT_BUFFER, *cmdBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "State setup failed");

	{
		const int	resultBlockAlignedSize		= getResultBlockAlignedSize(gl);
		deIntptr	curOffset					= 0;

		for (vector<DispatchCommand>::const_iterator cmdIter = m_commands.begin(); cmdIter != m_commands.end(); ++cmdIter)
		{
			gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, *resultBuffer, (glw::GLintptr)curOffset, resultBlockAlignedSize);
			gl.dispatchComputeIndirect((glw::GLintptr)cmdIter->offset);

			curOffset += resultBlockAlignedSize;
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchComputeIndirect() failed");

	if (verifyResultBuffer(*resultBuffer))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid values in result buffer");

	return STOP;
}